

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O3

TIfStackEntry __thiscall tcpp::Preprocessor::_processIfndefConditional(Preprocessor *this)

{
  pointer pTVar1;
  size_t sVar2;
  TIfStackEntry *pTVar3;
  long *__s2;
  int iVar4;
  long lVar5;
  _Elt_pointer pTVar6;
  uint uVar7;
  pointer pTVar8;
  long lVar9;
  pointer pTVar10;
  string macroIdentifier;
  TToken currToken;
  long *local_c0;
  size_t local_b8;
  long local_b0 [2];
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  size_t local_78;
  size_t sStack_70;
  undefined1 local_68 [8];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  size_t local_40;
  size_t sStack_38;
  
  Lexer::_getNextTokenInternal((TToken *)local_68,this->mpLexer,false);
  local_a0._0_4_ = SPACE;
  _expect(this,(E_TOKEN_TYPE *)local_a0,(E_TOKEN_TYPE *)local_68);
  Lexer::_getNextTokenInternal((TToken *)local_a0,this->mpLexer,false);
  local_68._0_4_ = local_a0._0_4_;
  std::__cxx11::string::operator=((string *)&local_60,(string *)&local_98);
  local_40 = local_78;
  sStack_38 = sStack_70;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  local_a0._0_4_ = IDENTIFIER;
  _expect(this,(E_TOKEN_TYPE *)local_a0,(E_TOKEN_TYPE *)local_68);
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_60._M_p,local_60._M_p + local_58);
  do {
    Lexer::_getNextTokenInternal((TToken *)local_a0,this->mpLexer,false);
    local_68._0_4_ = local_a0._0_4_;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_98);
    local_40 = local_78;
    sStack_38 = sStack_70;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
  } while (local_68._0_4_ == SPACE);
  local_a0._0_4_ = NEWLINE;
  _expect(this,(E_TOKEN_TYPE *)local_a0,(E_TOKEN_TYPE *)local_68);
  sVar2 = local_b8;
  __s2 = local_c0;
  pTVar10 = (this->mSymTable).
            super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (this->mSymTable).super__Vector_base<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pTVar1 - (long)pTVar10;
  lVar9 = (lVar5 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  if (0 < lVar9) {
    lVar5 = lVar9 + 1;
    pTVar8 = pTVar10 + 2;
    do {
      if ((sVar2 == pTVar8[-2].mName._M_string_length) &&
         ((sVar2 == 0 || (iVar4 = bcmp(pTVar8[-2].mName._M_dataplus._M_p,__s2,sVar2), iVar4 == 0))))
      {
        pTVar8 = pTVar8 + -2;
        goto LAB_001593a9;
      }
      if ((sVar2 == pTVar8[-1].mName._M_string_length) &&
         ((sVar2 == 0 || (iVar4 = bcmp(pTVar8[-1].mName._M_dataplus._M_p,__s2,sVar2), iVar4 == 0))))
      {
        pTVar8 = pTVar8 + -1;
        goto LAB_001593a9;
      }
      if ((sVar2 == (pTVar8->mName)._M_string_length) &&
         ((sVar2 == 0 || (iVar4 = bcmp((pTVar8->mName)._M_dataplus._M_p,__s2,sVar2), iVar4 == 0))))
      goto LAB_001593a9;
      if ((sVar2 == pTVar8[1].mName._M_string_length) &&
         ((sVar2 == 0 || (iVar4 = bcmp(pTVar8[1].mName._M_dataplus._M_p,__s2,sVar2), iVar4 == 0))))
      {
        pTVar8 = pTVar8 + 1;
        goto LAB_001593a9;
      }
      lVar5 = lVar5 + -1;
      pTVar8 = pTVar8 + 4;
    } while (1 < lVar5);
    lVar5 = (long)pTVar1 - (long)(pTVar10 + lVar9 * 4);
    pTVar10 = pTVar10 + lVar9 * 4;
  }
  lVar5 = (lVar5 >> 3) * 0x2e8ba2e8ba2e8ba3;
  pTVar8 = pTVar1;
  if (lVar5 == 3) {
    sVar2 = (pTVar10->mName)._M_string_length;
    if ((local_b8 != sVar2) ||
       ((sVar2 != 0 && (iVar4 = bcmp((pTVar10->mName)._M_dataplus._M_p,local_c0,sVar2), iVar4 != 0))
       )) {
      pTVar10 = pTVar10 + 1;
      goto LAB_0015934d;
    }
LAB_00159397:
    pTVar8 = pTVar10;
  }
  else {
    if (lVar5 == 2) {
LAB_0015934d:
      if ((local_b8 != (pTVar10->mName)._M_string_length) ||
         ((local_b8 != 0 &&
          (iVar4 = bcmp((pTVar10->mName)._M_dataplus._M_p,local_c0,local_b8), iVar4 != 0)))) {
        pTVar10 = pTVar10 + 1;
        goto LAB_00159371;
      }
      goto LAB_00159397;
    }
    if (lVar5 == 1) {
LAB_00159371:
      if ((local_b8 == (pTVar10->mName)._M_string_length) &&
         ((local_b8 == 0 ||
          (iVar4 = bcmp((pTVar10->mName)._M_dataplus._M_p,local_c0,local_b8), iVar4 == 0))))
      goto LAB_00159397;
    }
  }
LAB_001593a9:
  pTVar6 = (this->mConditionalBlocksStack).c.
           super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pTVar6 == (this->mConditionalBlocksStack).c.
                super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    uVar7 = 0x1000000;
    goto LAB_001593f9;
  }
  if (pTVar6 == (this->mConditionalBlocksStack).c.
                super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pTVar3 = (this->mConditionalBlocksStack).c.
             super__Deque_base<tcpp::Preprocessor::TIfStackEntry,_std::allocator<tcpp::Preprocessor::TIfStackEntry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
    if (pTVar3[0x7f].mIsParentBlockActive != false) {
      pTVar6 = pTVar3 + 0x80;
      goto LAB_001593eb;
    }
  }
  else if (pTVar6[-1].mIsParentBlockActive != false) {
LAB_001593eb:
    uVar7 = (pTVar6[-1].mShouldBeSkipped ^ 1) << 0x18;
    goto LAB_001593f9;
  }
  uVar7 = 0;
LAB_001593f9:
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p,local_50._M_allocated_capacity + 1);
  }
  return (TIfStackEntry)((uint)(pTVar8 != pTVar1) | (uint)(pTVar8 == pTVar1) << 0x10 | uVar7);
}

Assistant:

Preprocessor::TIfStackEntry Preprocessor::_processIfndefConditional() TCPP_NOEXCEPT
	{
		auto currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::SPACE, currToken.mType);

		currToken = mpLexer->GetNextToken();
		_expect(E_TOKEN_TYPE::IDENTIFIER, currToken.mType);

		std::string macroIdentifier = currToken.mRawView;

		do {
			currToken = mpLexer->GetNextToken();
		} while (currToken.mType == E_TOKEN_TYPE::SPACE);

		_expect(E_TOKEN_TYPE::NEWLINE, currToken.mType);

		bool skip = std::find_if(mSymTable.cbegin(), mSymTable.cend(), [&macroIdentifier](auto&& item)
			{
				return item.mName == macroIdentifier;
			}) != mSymTable.cend();

		// \note IsParentBlockActive is used to inherit disabled state for nested blocks
		return TIfStackEntry(skip, IsParentBlockActive(mConditionalBlocksStack));
	}